

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O2

void __thiscall Js::Profiler::MergeTree(Profiler *this,TypeNode *toNode,TypeNode *fromNode)

{
  TypeNode *fromNode_00;
  TreeNode<Js::UnitData,_373> *this_00;
  TypeNode *fromChild;
  long lVar1;
  
  (toNode->value).count = (toNode->value).count + (fromNode->value).count;
  lVar1 = (fromNode->value).excl;
  (toNode->value).incl = (toNode->value).incl + (fromNode->value).incl;
  (toNode->value).excl = (toNode->value).excl + lVar1;
  lVar1 = (fromNode->value).max;
  if ((toNode->value).max < lVar1) {
    (toNode->value).max = lVar1;
  }
  for (lVar1 = 4; lVar1 != 0x179; lVar1 = lVar1 + 1) {
    fromNode_00 = fromNode->children[lVar1 + -4];
    if (fromNode_00 != (TypeNode *)0x0) {
      this_00 = toNode->children[lVar1 + -4];
      if (this_00 == (TreeNode<Js::UnitData,_373> *)0x0) {
        this_00 = (TreeNode<Js::UnitData,_373> *)
                  new<Memory::ArenaAllocator>(0xbd0,this->alloc,0x35916e);
        TreeNode<Js::UnitData,_373>::TreeNode(this_00,toNode);
        toNode->children[lVar1 + -4] = this_00;
      }
      MergeTree(this,this_00,fromNode_00);
    }
  }
  return;
}

Assistant:

void
    Profiler::MergeTree(TypeNode * toNode, TypeNode * fromNode)
    {
        UnitData * toData = toNode->GetValue();
        const UnitData * fromData = fromNode->GetValue();

        toData->count += fromData->count;
        toData->incl += fromData->incl;
        toData->excl += fromData->excl;
        if (fromData->max > toData->max)
        {
            toData->max = fromData->max;
        }
        for (int i = 0; i < PhaseCount; i++)
        {
            if (fromNode->ChildExistsAt(i))
            {
                TypeNode * fromChild = fromNode->GetChildAt(i);
                TypeNode * toChild;
                if (!toNode->ChildExistsAt(i))
                {
                    toChild = Anew(this->alloc, TypeNode, toNode);
                    toNode->SetChildAt(i, toChild);
                }
                else
                {
                    toChild = toNode->GetChildAt(i);
                }
                MergeTree(toChild, fromChild);
            }
        }
    }